

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O0

string * __thiscall
libcellml::GeneratorProfile::voiString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this)

{
  GeneratorProfile *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->mPimpl->mVoiString)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::voiString() const
{
    return mPimpl->mVoiString;
}